

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

target_ulong_conflict mmu_probe_sparc(CPUSPARCState *env,target_ulong_conflict address,int mmulev)

{
  uint32_t uVar1;
  undefined8 in_RAX;
  MemTxResult result;
  MemTxResult local_24;
  
  local_24 = (MemTxResult)((ulong)in_RAX >> 0x20);
  uVar1 = address_space_ldl_sparc
                    ((uc_struct_conflict8 *)(*(AddressSpace **)(env[-0xd].regbase + 0x6c))->uc,
                     *(AddressSpace **)(env[-0xd].regbase + 0x6c),
                     (ulong)(env->mmuregs[2] << 2) + (ulong)(env->mmuregs[1] << 4),(MemTxAttrs)0x1,
                     &local_24);
  if ((local_24 == 0) && ((uVar1 & 3) == 1)) {
    if (mmulev == 3) {
      return uVar1;
    }
    uVar1 = address_space_ldl_sparc
                      ((uc_struct_conflict8 *)(*(AddressSpace **)(env[-0xd].regbase + 0x6c))->uc,
                       *(AddressSpace **)(env[-0xd].regbase + 0x6c),
                       (ulong)((uVar1 & 0xffffffc) * 0x10 + (address >> 0x18) * 4),(MemTxAttrs)0x1,
                       &local_24);
    if (local_24 == 0) {
      switch(uVar1 & 3) {
      case 1:
        if (mmulev == 2) {
          return uVar1;
        }
        uVar1 = address_space_ldl_sparc
                          ((uc_struct_conflict8 *)(*(AddressSpace **)(env[-0xd].regbase + 0x6c))->uc
                           ,*(AddressSpace **)(env[-0xd].regbase + 0x6c),
                           (ulong)((uVar1 & 0xffffffc) * 0x10 + (address >> 0x10 & 0xfc)),
                           (MemTxAttrs)0x1,&local_24);
        if (local_24 == 0) {
          switch(uVar1 & 3) {
          case 1:
            if (mmulev == 1) {
              return uVar1;
            }
            uVar1 = address_space_ldl_sparc
                              ((uc_struct_conflict8 *)
                               (*(AddressSpace **)(env[-0xd].regbase + 0x6c))->uc,
                               *(AddressSpace **)(env[-0xd].regbase + 0x6c),
                               (ulong)((uVar1 & 0xffffffc) * 0x10 + (address >> 10 & 0xfc)),
                               (MemTxAttrs)0x1,&local_24);
            if (local_24 != 0) {
              return 0;
            }
            if ((uVar1 & 3) != 2) {
              return 0;
            }
            return uVar1;
          case 2:
            return uVar1;
          }
        }
        break;
      case 2:
        goto switchD_009f2f66_caseD_2;
      }
    }
  }
  uVar1 = 0;
switchD_009f2f66_caseD_2:
  return uVar1;
}

Assistant:

target_ulong mmu_probe(CPUSPARCState *env, target_ulong address, int mmulev)
{
    CPUState *cs = env_cpu(env);
    hwaddr pde_ptr;
    uint32_t pde;
    MemTxResult result;

    /*
     * TODO: MMU probe operations are supposed to set the fault
     * status registers, but we don't do this.
     */

    /* Context base + context number */
    pde_ptr = (hwaddr)(env->mmuregs[1] << 4) +
        (env->mmuregs[2] << 2);
    pde = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, pde_ptr, MEMTXATTRS_UNSPECIFIED, &result);
    if (result != MEMTX_OK) {
        return 0;
    }

    switch (pde & PTE_ENTRYTYPE_MASK) {
    default:
    case 0: /* Invalid */
    case 2: /* PTE, maybe should not happen? */
    case 3: /* Reserved */
        return 0;
    case 1: /* L1 PDE */
        if (mmulev == 3) {
            return pde;
        }
        pde_ptr = ((address >> 22) & ~3) + ((pde & ~3) << 4);
        pde = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, pde_ptr,
                                MEMTXATTRS_UNSPECIFIED, &result);
        if (result != MEMTX_OK) {
            return 0;
        }

        switch (pde & PTE_ENTRYTYPE_MASK) {
        default:
        case 0: /* Invalid */
        case 3: /* Reserved */
            return 0;
        case 2: /* L1 PTE */
            return pde;
        case 1: /* L2 PDE */
            if (mmulev == 2) {
                return pde;
            }
            pde_ptr = ((address & 0xfc0000) >> 16) + ((pde & ~3) << 4);
            pde = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, pde_ptr,
                                    MEMTXATTRS_UNSPECIFIED, &result);
            if (result != MEMTX_OK) {
                return 0;
            }

            switch (pde & PTE_ENTRYTYPE_MASK) {
            default:
            case 0: /* Invalid */
            case 3: /* Reserved */
                return 0;
            case 2: /* L2 PTE */
                return pde;
            case 1: /* L3 PDE */
                if (mmulev == 1) {
                    return pde;
                }
                pde_ptr = ((address & 0x3f000) >> 10) + ((pde & ~3) << 4);
                pde = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, pde_ptr,
                                        MEMTXATTRS_UNSPECIFIED, &result);
                if (result != MEMTX_OK) {
                    return 0;
                }

                switch (pde & PTE_ENTRYTYPE_MASK) {
                default:
                case 0: /* Invalid */
                case 1: /* PDE, should not happen */
                case 3: /* Reserved */
                    return 0;
                case 2: /* L3 PTE */
                    return pde;
                }
            }
        }
    }
    return 0;
}